

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container_test.cpp
# Opt level: O3

void __thiscall Container::test_CopyStaticArray::test_method(test_CopyStaticArray *this)

{
  undefined8 uVar1;
  char *pcVar2;
  void *pvVar3;
  char *pcVar4;
  char *pcVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  char *local_140;
  char *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  char *local_120;
  char *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  char *local_c8;
  undefined **local_c0;
  undefined1 local_b8;
  undefined8 *local_b0;
  undefined ***local_a8;
  undefined1 local_a0;
  undefined1 local_98 [16];
  undefined4 *local_88;
  undefined4 *local_80;
  undefined **local_78;
  undefined1 local_70 [8];
  shared_count sStack_68;
  undefined4 **local_60;
  undefined **local_58;
  char *local_50;
  undefined8 *local_48;
  char *local_40;
  undefined4 local_38;
  undefined4 local_34;
  
  pcVar2 = (char *)operator_new__(0x10);
  pcVar2[0] = '\x01';
  pcVar2[1] = '\0';
  pcVar2[2] = '\0';
  pcVar2[3] = '\0';
  pcVar2[4] = '\x02';
  pcVar2[5] = '\0';
  pcVar2[6] = '\0';
  pcVar2[7] = '\0';
  pcVar2[8] = '\x03';
  pcVar2[9] = '\0';
  pcVar2[10] = '\0';
  pcVar2[0xb] = '\0';
  pcVar2[0xc] = '\x04';
  pcVar2[0xd] = '\0';
  pcVar2[0xe] = '\0';
  pcVar2[0xf] = '\0';
  pvVar3 = operator_new__(4);
  local_140 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/fedyura[P]esoinn_text/src/container/test/container_test.cpp"
  ;
  local_138 = "";
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_140,0x21);
  local_50 = (char *)((ulong)local_50 & 0xffffffffffffff00);
  local_58 = &PTR__lazy_ostream_00109bd0;
  local_48 = &boost::unit_test::lazy_ostream::inst;
  local_40 = "";
  local_88 = &local_38;
  local_38 = 1;
  local_80 = &local_34;
  local_34 = 1;
  local_a0 = 1;
  local_98 = (undefined1  [16])0x0;
  local_a8 = (undefined ***)&local_88;
  local_b8 = 0;
  local_c0 = &PTR__lazy_ostream_00109c20;
  local_b0 = &boost::unit_test::lazy_ostream::inst;
  local_60 = &local_80;
  local_70 = (undefined1  [8])(stack0xffffffffffffff91 << 8);
  local_78 = &PTR__lazy_ostream_00109c60;
  sStack_68.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count((shared_count *)(local_98 + 8));
  pcVar4 = (char *)operator_new__(0x10);
  uVar1 = *(undefined8 *)(pcVar2 + 8);
  *(undefined8 *)pcVar4 = *(undefined8 *)pcVar2;
  *(undefined8 *)(pcVar4 + 8) = uVar1;
  operator_delete__(pvVar3);
  local_120 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/fedyura[P]esoinn_text/src/container/test/container_test.cpp"
  ;
  local_118 = "";
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_120,0x24);
  auVar6[0] = -(*pcVar4 == *pcVar2);
  auVar6[1] = -(pcVar4[1] == pcVar2[1]);
  auVar6[2] = -(pcVar4[2] == pcVar2[2]);
  auVar6[3] = -(pcVar4[3] == pcVar2[3]);
  auVar6[4] = -(pcVar4[4] == pcVar2[4]);
  auVar6[5] = -(pcVar4[5] == pcVar2[5]);
  auVar6[6] = -(pcVar4[6] == pcVar2[6]);
  auVar6[7] = -(pcVar4[7] == pcVar2[7]);
  auVar6[8] = -(pcVar4[8] == pcVar2[8]);
  auVar6[9] = -(pcVar4[9] == pcVar2[9]);
  auVar6[10] = -(pcVar4[10] == pcVar2[10]);
  auVar6[0xb] = -(pcVar4[0xb] == pcVar2[0xb]);
  auVar6[0xc] = -(pcVar4[0xc] == pcVar2[0xc]);
  auVar6[0xd] = -(pcVar4[0xd] == pcVar2[0xd]);
  auVar6[0xe] = -(pcVar4[0xe] == pcVar2[0xe]);
  auVar6[0xf] = -(pcVar4[0xf] == pcVar2[0xf]);
  _local_70 = (undefined1  [16])0x0;
  local_58 = (undefined **)0x10718d;
  local_50 = "";
  local_b8 = 0;
  local_c0 = &PTR__lazy_ostream_00109d60;
  local_b0 = &boost::unit_test::lazy_ostream::inst;
  local_a8 = &local_58;
  local_100 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/fedyura[P]esoinn_text/src/container/test/container_test.cpp"
  ;
  local_f8 = "";
  local_78._0_1_ =
       (ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) | (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar6 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar6 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar6 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar6 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar6 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar6 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar6 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar6 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar6 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar6 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar6 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar6 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar6 >> 0x77,0) & 1) << 0xe | (ushort)(auVar6[0xf] >> 7) << 0xf)
       == 0xffff;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count((shared_count *)(local_70 + 8));
  pcVar5 = (char *)operator_new__(0x10);
  uVar1 = *(undefined8 *)(pcVar2 + 8);
  *(undefined8 *)pcVar5 = *(undefined8 *)pcVar2;
  *(undefined8 *)(pcVar5 + 8) = uVar1;
  local_f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/fedyura[P]esoinn_text/src/container/test/container_test.cpp"
  ;
  local_e8 = "";
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_f0,0x27);
  auVar7[0] = -(*pcVar5 == *pcVar2);
  auVar7[1] = -(pcVar5[1] == pcVar2[1]);
  auVar7[2] = -(pcVar5[2] == pcVar2[2]);
  auVar7[3] = -(pcVar5[3] == pcVar2[3]);
  auVar7[4] = -(pcVar5[4] == pcVar2[4]);
  auVar7[5] = -(pcVar5[5] == pcVar2[5]);
  auVar7[6] = -(pcVar5[6] == pcVar2[6]);
  auVar7[7] = -(pcVar5[7] == pcVar2[7]);
  auVar7[8] = -(pcVar5[8] == pcVar2[8]);
  auVar7[9] = -(pcVar5[9] == pcVar2[9]);
  auVar7[10] = -(pcVar5[10] == pcVar2[10]);
  auVar7[0xb] = -(pcVar5[0xb] == pcVar2[0xb]);
  auVar7[0xc] = -(pcVar5[0xc] == pcVar2[0xc]);
  auVar7[0xd] = -(pcVar5[0xd] == pcVar2[0xd]);
  auVar7[0xe] = -(pcVar5[0xe] == pcVar2[0xe]);
  auVar7[0xf] = -(pcVar5[0xf] == pcVar2[0xf]);
  local_78 = (undefined **)
             CONCAT71(local_78._1_7_,
                      (ushort)((ushort)(SUB161(auVar7 >> 7,0) & 1) |
                               (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1 |
                               (ushort)(SUB161(auVar7 >> 0x17,0) & 1) << 2 |
                               (ushort)(SUB161(auVar7 >> 0x1f,0) & 1) << 3 |
                               (ushort)(SUB161(auVar7 >> 0x27,0) & 1) << 4 |
                               (ushort)(SUB161(auVar7 >> 0x2f,0) & 1) << 5 |
                               (ushort)(SUB161(auVar7 >> 0x37,0) & 1) << 6 |
                               (ushort)(SUB161(auVar7 >> 0x3f,0) & 1) << 7 |
                               (ushort)(SUB161(auVar7 >> 0x47,0) & 1) << 8 |
                               (ushort)(SUB161(auVar7 >> 0x4f,0) & 1) << 9 |
                               (ushort)(SUB161(auVar7 >> 0x57,0) & 1) << 10 |
                               (ushort)(SUB161(auVar7 >> 0x5f,0) & 1) << 0xb |
                               (ushort)(SUB161(auVar7 >> 0x67,0) & 1) << 0xc |
                               (ushort)(SUB161(auVar7 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar7 >> 0x77,0) & 1) << 0xe |
                              (ushort)(auVar7[0xf] >> 7) << 0xf) == 0xffff);
  _local_70 = (undefined1  [16])0x0;
  local_58 = (undefined **)0x1071ca;
  local_50 = "";
  local_b8 = 0;
  local_c0 = &PTR__lazy_ostream_00109d60;
  local_b0 = &boost::unit_test::lazy_ostream::inst;
  local_a8 = &local_58;
  local_d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/fedyura[P]esoinn_text/src/container/test/container_test.cpp"
  ;
  local_c8 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count((shared_count *)(local_70 + 8));
  operator_delete__(pcVar5);
  operator_delete__(pcVar4);
  operator_delete__(pcVar2);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_CopyStaticArray)
{
    uint32_t size = 4;
    cont::StaticArray<uint32_t> arr(size);
    arr[0] = 1;
    arr[1] = 2;
    arr[2] = 3;
    arr[3] = 4;
    
    cont::StaticArray<uint32_t> arr2(1);
    BOOST_CHECK_EQUAL(arr2.size(), 1);
    
    arr2 = arr; 
    BOOST_CHECK(std::equal(arr.data(), arr.data() + arr.size(), arr2.data()));

    cont::StaticArray<uint32_t> arr3(arr);
    BOOST_CHECK(std::equal(arr.data(), arr.data() + arr.size(), arr3.data()));
    
    cont::StaticArray<uint32_t> arr4 = arr;
}